

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O2

Status __thiscall
soplex::SPxSolverBase<double>::getDualfarkas
          (SPxSolverBase<double> *this,VectorBase<double> *p_vector)

{
  Status SVar1;
  SPxStatusException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->initialized != false) {
    VectorBase<double>::clear(p_vector);
    VectorBase<double>::operator=(p_vector,&(this->dualFarkas).super_SVectorBase<double>);
    SVar1 = status(this);
    return SVar1;
  }
  this_00 = (SPxStatusException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_38,"XSOLVE10 No Problem loaded",&local_39);
  SPxStatusException::SPxStatusException(this_00,&local_38);
  __cxa_throw(this_00,&SPxStatusException::typeinfo,SPxException::~SPxException);
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getDualfarkas(VectorBase<R>& p_vector) const
{

   assert(isInitialized());

   if(!isInitialized())
   {
      throw SPxStatusException("XSOLVE10 No Problem loaded");
      // return NOT_INIT;
   }

   assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::INFEASIBLE);
   p_vector.clear();
   p_vector = dualFarkas;

   return status();
}